

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void linreg_multi(int p,double *xi,double *y,int N,double *b,double *sigma2,double *xxti,double *R2,
                 double *res,double alpha,double *anv,double *ci_lower,double *ci_upper,int *rank,
                 char *llsmethod,int intercept)

{
  int iVar1;
  double *col;
  double *sig;
  double *C;
  double *C_00;
  double *A;
  double *C_01;
  int *ipiv_00;
  double *C_02;
  double *C_03;
  void *__ptr;
  double *C_04;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_108;
  double local_100;
  double rss;
  double mss;
  double dfi;
  double chi1a2;
  double chia2;
  double intrvl;
  double ta2;
  double a2;
  double ym2;
  double ym;
  double sum;
  double tmp1;
  int *ipiv;
  int df;
  int i;
  double *xxt2;
  double *bt;
  double *temp2;
  double *temp1;
  double *yxt;
  double *xxt;
  double *xb;
  double *seb;
  double *xt;
  double *x;
  double alpha_local;
  double *sigma2_local;
  double *b_local;
  int N_local;
  double *y_local;
  double *xi_local;
  int p_local;
  
  col = (double *)malloc((long)p * 8 * (long)N);
  sig = (double *)malloc((long)p * 8 * (long)N);
  C = (double *)malloc((long)N << 3);
  C_00 = (double *)malloc((long)p * 8 * (long)p);
  A = (double *)malloc((long)p * 8 * (long)p);
  C_01 = (double *)malloc((long)p << 3);
  ipiv_00 = (int *)malloc((long)p << 2);
  C_02 = (double *)calloc(1,8);
  C_03 = (double *)malloc((long)p << 3);
  __ptr = malloc((long)p << 3);
  C_04 = (double *)calloc(1,8);
  if (intercept == 1) {
    for (ipiv._4_4_ = 0; iVar1 = N, ipiv._4_4_ < N; ipiv._4_4_ = ipiv._4_4_ + 1) {
      sig[ipiv._4_4_] = 1.0;
    }
    while (ipiv._4_4_ = iVar1, ipiv._4_4_ < p * N) {
      sig[ipiv._4_4_] = xi[ipiv._4_4_ - N];
      iVar1 = ipiv._4_4_ + 1;
    }
  }
  else if (intercept == 0) {
    for (ipiv._4_4_ = 0; ipiv._4_4_ < p * N; ipiv._4_4_ = ipiv._4_4_ + 1) {
      sig[ipiv._4_4_] = xi[ipiv._4_4_];
    }
  }
  mtranspose(sig,p,N,col);
  mmult(sig,col,C_00,p,N,p);
  memcpy(A,C_00,(long)p * 8 * (long)p);
  mmult(sig,y,C_01,p,N,1);
  if (0 < p) {
    iVar1 = strcmp(llsmethod,"qr");
    if (iVar1 == 0) {
      iVar1 = lls_qr(C_00,C_01,p,p,b);
      *rank = iVar1;
    }
    else {
      iVar1 = strcmp(llsmethod,"normal");
      if (iVar1 == 0) {
        lls_normal(C_00,C_01,p,p,b);
        printf(
              "Warning - This method will not calculate the rank of the regression. Use method qr instead. \n"
              );
      }
      else {
        iVar1 = strcmp(llsmethod,"svd");
        if (iVar1 != 0) {
          printf("This function only accepts one of three least square methods - \n");
          printf(" qr, normal and svd. \n");
          exit(-1);
        }
        lls_svd2(C_00,C_01,p,p,b);
        printf(
              "Warning - This method will not calculate the rank of the regression. Use method qr instead. \n"
              );
      }
    }
  }
  iVar1 = N - p;
  mmult(y,y,C_04,1,N,1);
  mmult(sig,y,C_03,p,N,1);
  mmult(b,C_03,C_02,1,p,1);
  *sigma2 = *C_04 - *C_02;
  *sigma2 = *sigma2 / (double)iVar1;
  dVar5 = *sigma2;
  ludecomp(A,p,ipiv_00);
  minverse(A,p,ipiv_00,xxti);
  for (ipiv._4_4_ = 0; ipiv._4_4_ < p * p; ipiv._4_4_ = ipiv._4_4_ + 1) {
    xxti[ipiv._4_4_] = dVar5 * xxti[ipiv._4_4_];
  }
  ym = 0.0;
  for (ipiv._4_4_ = 0; ipiv._4_4_ < N; ipiv._4_4_ = ipiv._4_4_ + 1) {
    ym = y[ipiv._4_4_] + ym;
  }
  dVar2 = (ym / (double)N) * (ym / (double)N);
  *R2 = (-(double)N * dVar2 + *C_02) / (-(double)N * dVar2 + *C_04);
  local_108 = 1.0;
  if (intercept != 1) {
    local_108 = 0.0;
  }
  R2[1] = 1.0 - ((1.0 - *R2) * ((double)N - local_108)) / (double)iVar1;
  dVar3 = alpha / 2.0;
  for (ipiv._4_4_ = 0; ipiv._4_4_ < p; ipiv._4_4_ = ipiv._4_4_ + 1) {
    dVar4 = sqrt(xxti[ipiv._4_4_ * (p + 1)]);
    *(double *)((long)__ptr + (long)ipiv._4_4_ * 8) = dVar4;
    dVar4 = tinv(dVar3,iVar1);
    dVar4 = dVar4 * *(double *)((long)__ptr + (long)ipiv._4_4_ * 8);
    ci_lower[ipiv._4_4_] = b[ipiv._4_4_] - dVar4;
    ci_upper[ipiv._4_4_] = b[ipiv._4_4_] + dVar4;
  }
  dVar4 = chiinv(dVar3,iVar1);
  dVar3 = chiinv(1.0 - dVar3,iVar1);
  ci_lower[p] = ((double)iVar1 * dVar5) / dVar3;
  ci_upper[p] = ((double)iVar1 * dVar5) / dVar4;
  mmult(col,b,C,N,p,1);
  for (ipiv._4_4_ = 0; ipiv._4_4_ < N; ipiv._4_4_ = ipiv._4_4_ + 1) {
    res[ipiv._4_4_] = y[ipiv._4_4_] - C[ipiv._4_4_];
  }
  rss = 0.0;
  local_100 = 0.0;
  for (ipiv._4_4_ = 0; ipiv._4_4_ < N; ipiv._4_4_ = ipiv._4_4_ + 1) {
    rss = C[ipiv._4_4_] * C[ipiv._4_4_] + rss;
    local_100 = res[ipiv._4_4_] * res[ipiv._4_4_] + local_100;
  }
  if (intercept == 1) {
    if (p == 1) {
      anv[1] = *R2 * (-(double)N * dVar2 + *C_04);
      anv[2] = (1.0 - *R2) * (-(double)N * dVar2 + *C_04);
      *anv = anv[1] + anv[2];
      anv[3] = 1.0 - local_108;
      anv[4] = (double)iVar1;
    }
    else if (1 < p) {
      anv[1] = *R2 * (-(double)N * dVar2 + *C_04);
      anv[2] = (1.0 - *R2) * (-(double)N * dVar2 + *C_04);
      *anv = anv[1] + anv[2];
      anv[3] = (double)p - local_108;
      anv[4] = (double)iVar1;
      anv[5] = (*R2 / anv[3]) / ((1.0 - *R2) / anv[4]);
      dVar5 = fcdf(anv[5],p + -1,iVar1);
      anv[6] = 1.0 - dVar5;
    }
  }
  else {
    *R2 = rss / (rss + local_100);
    R2[1] = 1.0 - ((1.0 - *R2) * ((double)N - local_108)) / (double)iVar1;
    if (p == 1) {
      anv[1] = rss;
      anv[2] = local_100;
      *anv = anv[1] + anv[2];
      anv[3] = 1.0;
      anv[4] = (double)iVar1;
      anv[5] = (*R2 / anv[3]) / ((1.0 - *R2) / anv[4]);
      dVar5 = fcdf(anv[5],1,iVar1);
      anv[6] = 1.0 - dVar5;
    }
    else if (p < 2) {
      if (p == 0) {
        anv[1] = rss;
        anv[2] = local_100;
        *anv = anv[1] + anv[2];
        anv[3] = 0.0;
        anv[4] = (double)iVar1;
        anv[5] = NAN;
        anv[6] = NAN;
      }
    }
    else {
      anv[1] = rss;
      anv[2] = local_100;
      *anv = anv[1] + anv[2];
      anv[3] = (double)p;
      anv[4] = (double)iVar1;
      anv[5] = (*R2 / anv[3]) / ((1.0 - *R2) / anv[4]);
      dVar5 = fcdf(anv[5],p + -1,iVar1);
      anv[6] = 1.0 - dVar5;
    }
  }
  free(ipiv_00);
  free(col);
  free(sig);
  free(C_00);
  free(A);
  free(C_01);
  free(C_02);
  free(C_03);
  free(C_04);
  free(__ptr);
  free(C);
  return;
}

Assistant:

void linreg_multi(int p, double *xi, double *y, int N, double* b, double *sigma2,
	double *xxti, double *R2, double *res, double alpha, double *anv,
	double* ci_lower, double* ci_upper, int *rank, char *llsmethod, int intercept) {
	/*
	p corresponds to number of coefficients (including the intercept)
	intercept - 1 : include intercept term. 0 : No intercept term
	*/
	double *x, *xt, *seb, *xb;
	double *xxt, *yxt, *temp1, *temp2, *bt, *xxt2;
	int i, df;
	int *ipiv;
	double tmp1, sum, ym, ym2, a2, ta2, intrvl, chia2, chi1a2, dfi, mss, rss;

	/*
	* Matrix Based Multiple Regression
	* y has the length N
	* xi has the length (p-1) X N. It contains p-1 independent variables
	* of length N each
	*/

	x = (double*)malloc(sizeof(double) * p * N);
	xt = (double*)malloc(sizeof(double) * p * N);
	xb = (double*)malloc(sizeof(double) * N);
	xxt = (double*)malloc(sizeof(double) * p * p);
	xxt2 = (double*)malloc(sizeof(double) * p * p);
	yxt = (double*)malloc(sizeof(double) * p);
	ipiv = (int*)malloc(sizeof(int) * p);
	//yt = (double*) malloc (sizeof(double) * N);
	temp1 = (double*)calloc(1, sizeof(double));
	temp2 = (double*)malloc(sizeof(double) * p);
	seb = (double*)malloc(sizeof(double) * p);
	bt = (double*)calloc(1, sizeof(double));

	// Initalize xt matrix - Transpose Matrix is initilaized first to
	// deal with column major nature of the X matrix

	if (intercept == 1) {
		for (i = 0; i < N; ++i) {
			xt[i] = 1.;
		}

		for (i = N; i < p*N; ++i) {
			xt[i] = xi[i - N];
		}
	}
	else if (intercept == 0) {
		for (i = 0; i < p*N; ++i) {
			xt[i] = xi[i];
		}
	}


	// Calculate x * x'

	mtranspose(xt, p, N, x);

	//cblas_dgemm(CblasRowMajor,CblasNoTrans,CblasNoTrans,ra,cb,ca,1.0,x,ca,xt,cb,0.0,xxt,cb);
	mmult(xt, x, xxt, p, N, p);
	memcpy(xxt2, xxt, sizeof(double)*p*p);

	// Calculate  x' * y

	//cblas_dgemm(CblasRowMajor,CblasNoTrans,CblasNoTrans,ra,cb,ca,1.0,y,ca,xt,cb,0.0,yxt,cb);
	mmult(xt, y, yxt, p, N, 1);

	// Find LU decomposition and then solve Ax = B
	// A = L * U where A = xxt
	// x is b vector and
	// B is yxt

	//ludecomp(xxt,p,ipiv);
	//linsolve(xxt,p,yxt,ipiv,b);
	if (p > 0) {
		if (!strcmp(llsmethod, "qr")) {
			*rank = lls_qr(xxt, yxt, p, p, b);
		}
		else if (!strcmp(llsmethod, "normal")) {
			lls_normal(xxt, yxt, p, p, b);
			printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
		}
		else if (!strcmp(llsmethod, "svd")) {
			lls_svd2(xxt, yxt, p, p, b);
			printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
		}
		else {
			printf("This function only accepts one of three least square methods - \n");
			printf(" qr, normal and svd. \n");
			exit(-1);
		}
	}

	//Find Variance of the residuals

	//mtranspose(y,N,1,yt);
	df = N - p;
	mmult(y, y, bt, 1, N, 1);
	mmult(xt, y, temp2, p, N, 1);
	mmult(b, temp2, temp1, 1, p, 1);

	*sigma2 = *bt - *temp1;
	*sigma2 /= (double)df;
	tmp1 = *sigma2;

	// Variance-Covariance Matrix of beta parameters
	ludecomp(xxt2, p, ipiv);
	minverse(xxt2, p, ipiv, xxti);

	for (i = 0; i < p*p; ++i) {
		xxti[i] *= tmp1;
	}


	// r^2 Goodness of fit
	sum = 0.;
	for (i = 0; i < N; ++i) {
		sum += y[i];
	}
	ym = sum / N;
	ym2 = ym * ym;

	R2[0] = (*temp1 - N*ym2) / (*bt - N*ym2);

	// Adjusted r^2

	dfi = intercept == 1 ? 1.0 : 0.0;

	R2[1] = 1.0 - (1.0 - R2[0]) * ((double)N - dfi) / ((double)df);

	a2 = alpha / 2.;

	//Confidence Interval for beta parameters

	for (i = 0; i < p; ++i) {
		seb[i] = sqrt(xxti[i*(p + 1)]);

		ta2 = tinv(a2, df);
		intrvl = ta2 * seb[i];

		ci_lower[i] = b[i] - intrvl;
		ci_upper[i] = b[i] + intrvl;

	}

	// confidence interval for sigma^2

	chia2 = chiinv(a2, df);
	chi1a2 = chiinv(1. - a2, df);

	ci_lower[p] = (double)df * tmp1 / chi1a2;
	ci_upper[p] = (double)df * tmp1 / chia2;

	//Residual
	/* u = y - Xb
	*/
	mmult(x, b, xb, N, p, 1);

	for (i = 0; i < N; ++i) {
		res[i] = y[i] - xb[i];
	}


	mss = 0.0;
	rss = 0.0;

	for (i = 0; i < N; ++i) {
		mss += (xb[i] * xb[i]);
		rss += (res[i] * res[i]);
	}

	// ANOVA

	/*
	* ANOVA
	*
	* anv[0] - TSS Total Sum Of Squares
	* anv[1] - ESS Explained Sum Of Squares
	* anv[2] - RSS Residual Sum Of Squares
	* anv[3] - degrees of freedom of ESS
	* anv[4] - degrees of freedom of RSS
	* anv[5] - F Statistics = (R^2/p-1)/((1-R^2)/N-p)
	* anv[6] - P value associated with anv[5] used to reject/accept
	* zero hypothesis
	*/

	if (intercept == 1) {
		if (p == 1) {
			anv[1] = R2[0] * (*bt - N*ym2);
			anv[2] = (1. - R2[0]) * (*bt - N*ym2);
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p - dfi;
			anv[4] = (double)df;
		}
		else if (p > 1) {
			anv[1] = R2[0] * (*bt - N*ym2);
			anv[2] = (1. - R2[0]) * (*bt - N*ym2);
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p - dfi;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p - 1, df);
		}
	}
	else {
		R2[0] = mss / (mss + rss);
		R2[1] = 1.0 - (1.0 - R2[0]) * ((double)N - dfi) / ((double)df);
		if (p == 1) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p, df);
		}
		else if (p > 1) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p - 1, df);
		}
		else if (p == 0) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = NAN;
			anv[6] = NAN;
		}
	}


	free(ipiv);
	free(x);
	free(xt);
	free(xxt);
	free(xxt2);
	free(yxt);
	free(temp1);
	free(temp2);
	free(bt);
	free(seb);
	free(xb);
}